

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

String * __thiscall
Rml::Parse::VariableOrFunctionName_abi_cxx11_
          (String *__return_storage_ptr__,Parse *this,DataParser *parser,
          bool *out_valid_function_name)

{
  bool bVar1;
  long lVar2;
  char local_23;
  bool local_22;
  char c;
  bool is_first_character;
  bool *out_valid_function_name_local;
  DataParser *parser_local;
  String *name;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_22 = true;
  local_23 = DataParser::Look((DataParser *)this);
  while (bVar1 = IsVariableCharacter(local_23,local_22), bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_23);
    local_23 = DataParser::Next((DataParser *)this);
    local_22 = false;
  }
  if (parser != (DataParser *)0x0) {
    lVar2 = ::std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x70cacb);
    (parser->expression)._M_dataplus = (_Alloc_hider)(lVar2 == -1);
  }
  return __return_storage_ptr__;
}

Assistant:

static String VariableOrFunctionName(DataParser& parser, bool* out_valid_function_name)
	{
		String name;
		bool is_first_character = true;
		char c = parser.Look();

		while (IsVariableCharacter(c, is_first_character))
		{
			name += c;
			c = parser.Next();
			is_first_character = false;
		}

		if (out_valid_function_name)
			*out_valid_function_name = (name.find_first_of(". ") == String::npos);

		return name;
	}